

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::RadioButton(char *label,bool active)

{
  float text_baseline_y;
  ImGuiWindow *this;
  ImDrawList *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImGuiID id;
  ImU32 IVar6;
  int iVar7;
  undefined7 in_register_00000031;
  char *text;
  ImGuiCol idx;
  char cVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar9;
  bool held;
  bool hovered;
  ImRect total_bb;
  bool local_a2;
  bool local_a1;
  float local_a0;
  undefined4 local_9c;
  ImVec2 local_98;
  ImVec2 local_90;
  float local_88;
  ImVec2 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  ImRect local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_9c = (undefined4)CONCAT71(in_register_00000031,active);
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    IVar2 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_68._8_4_ = extraout_XMM0_Dc;
    local_68._0_4_ = IVar2.x;
    local_68._4_4_ = IVar2.y;
    local_68._12_4_ = extraout_XMM0_Dd;
    local_88 = GetFrameHeight();
    local_78 = (this->DC).CursorPos;
    fVar9 = 0.0;
    if (0.0 < (float)local_68._0_4_) {
      fVar9 = (pIVar3->Style).ItemInnerSpacing.x + (float)local_68._0_4_;
    }
    text_baseline_y = (pIVar3->Style).FramePadding.y;
    local_58.Max.x = fVar9 + local_88 + local_78.x;
    local_58.Min = local_78;
    local_58.Max.y = text_baseline_y + text_baseline_y + (float)local_68._4_4_ + local_78.y;
    uStack_70 = 0;
    ItemSize(&local_58,text_baseline_y);
    bVar5 = false;
    bVar4 = ItemAdd(&local_58,id,(ImRect *)0x0,0);
    if (bVar4) {
      local_48 = local_88 + local_78.x;
      fStack_44 = local_88 + local_78.y;
      fStack_40 = local_88 + (float)uStack_70;
      fStack_3c = local_88 + uStack_70._4_4_;
      local_98.y = (float)(int)((fStack_44 + local_78.y) * 0.5 + 0.5);
      local_98.x = (float)(int)((local_48 + local_78.x) * 0.5 + 0.5);
      local_a0 = (local_88 + -1.0) * 0.5;
      bVar5 = ButtonBehavior(&local_58,id,&local_a1,&local_a2,0);
      if (bVar5) {
        MarkItemEdited(id);
      }
      RenderNavHighlight(&local_58,id,1);
      iVar7 = ((local_a2 ^ 1U) & local_a1) + 7;
      idx = 9;
      if ((local_a1 & 1U) == 0) {
        idx = iVar7;
      }
      pIVar1 = this->DrawList;
      if (local_a2 == false) {
        idx = iVar7;
      }
      IVar6 = GetColorU32(idx,1.0);
      ImDrawList::AddCircleFilled(pIVar1,&local_98,local_a0,IVar6,0x10);
      cVar8 = (char)local_9c;
      if (cVar8 != '\0') {
        fVar9 = 1.0;
        if (1.0 <= (float)(int)(local_88 / 6.0)) {
          fVar9 = (float)(int)(local_88 / 6.0);
        }
        pIVar1 = this->DrawList;
        local_88 = local_a0 - fVar9;
        IVar6 = GetColorU32(0x12,1.0);
        ImDrawList::AddCircleFilled(pIVar1,&local_98,local_88,IVar6,0x10);
      }
      if (0.0 < (pIVar3->Style).FrameBorderSize) {
        pIVar1 = this->DrawList;
        local_90.y = local_98.y + 1.0;
        local_90.x = local_98.x + 1.0;
        IVar6 = GetColorU32(6,1.0);
        cVar8 = (char)local_9c;
        ImDrawList::AddCircle(pIVar1,&local_90,local_a0,IVar6,0x10,(pIVar3->Style).FrameBorderSize);
        pIVar1 = this->DrawList;
        IVar6 = GetColorU32(5,1.0);
        ImDrawList::AddCircle(pIVar1,&local_98,local_a0,IVar6,0x10,(pIVar3->Style).FrameBorderSize);
      }
      local_90.y = (pIVar3->Style).FramePadding.y + local_78.y;
      local_90.x = (pIVar3->Style).ItemInnerSpacing.x + local_48;
      if (pIVar3->LogEnabled == true) {
        text = "( )";
        if (cVar8 != '\0') {
          text = "(x)";
        }
        LogRenderedText(&local_90,text,(char *)0x0);
      }
      if (0.0 < (float)local_68._0_4_) {
        RenderText(local_90,label,(char *)0x0,true);
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}